

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_smooth_predictor_4x8_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar10 [16];
  __m128i d;
  undefined1 auVar11 [16];
  __m128i rep;
  undefined1 auVar12 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  auVar4 = _DAT_00513a90;
  auVar3 = _DAT_00513a80;
  auVar2 = _DAT_00513a40;
  uVar1 = *(uint *)above;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)left;
  auVar10 = pshuflw(ZEXT416(uVar1 >> 0x18),ZEXT416(uVar1 >> 0x18),0);
  auVar11 = pshuflw(ZEXT116(left[7]),ZEXT116(left[7]),0);
  auVar7[0] = (byte)uVar1;
  auVar7[1] = 0;
  auVar9._0_12_ = ZEXT712(0);
  auVar9[0xc] = (char)(uVar1 >> 0x18);
  auVar9[0xd] = 0;
  auVar9._14_2_ = auVar11._6_2_;
  auVar8._12_4_ = auVar9._12_4_;
  auVar8._0_10_ = (unkuint10)0;
  auVar8._10_2_ = auVar11._4_2_;
  auVar7[9] = 0;
  auVar7[8] = (byte)(uVar1 >> 0x10);
  auVar7._10_6_ = auVar8._10_6_;
  auVar7._6_2_ = auVar11._2_2_;
  auVar7[5] = 0;
  auVar7[4] = (byte)(uVar1 >> 8);
  auVar7._2_2_ = auVar11._0_2_;
  iVar5 = 8;
  auVar8 = _DAT_00513a10;
  auVar9 = _DAT_004d8ba0;
  do {
    auVar11 = pshufb(auVar3,auVar8);
    auVar16 = pshufb(auVar4,auVar8);
    auVar15._0_12_ = auVar11._0_12_;
    auVar15._12_2_ = auVar11._6_2_;
    auVar15._14_2_ = auVar16._6_2_;
    auVar14._12_4_ = auVar15._12_4_;
    auVar14._0_10_ = auVar11._0_10_;
    auVar14._10_2_ = auVar16._4_2_;
    auVar13._10_6_ = auVar14._10_6_;
    auVar13._0_8_ = auVar11._0_8_;
    auVar13._8_2_ = auVar11._4_2_;
    auVar12._8_8_ = auVar13._8_8_;
    auVar12._6_2_ = auVar16._2_2_;
    auVar12._4_2_ = auVar11._2_2_;
    auVar12._0_2_ = auVar11._0_2_;
    auVar12._2_2_ = auVar16._0_2_;
    auVar11 = pmaddwd(auVar12,auVar7);
    auVar16 = pshufb(auVar6,auVar9);
    auVar20._0_12_ = auVar16._0_12_;
    auVar20._12_2_ = auVar16._6_2_;
    auVar20._14_2_ = auVar10._2_2_;
    auVar19._12_4_ = auVar20._12_4_;
    auVar19._0_10_ = auVar16._0_10_;
    auVar19._10_2_ = auVar10._0_2_;
    auVar18._10_6_ = auVar19._10_6_;
    auVar18._0_8_ = auVar16._0_8_;
    auVar18._8_2_ = auVar16._4_2_;
    auVar17._8_8_ = auVar18._8_8_;
    auVar17._6_2_ = auVar10._2_2_;
    auVar17._4_2_ = auVar16._2_2_;
    auVar17._0_2_ = auVar16._0_2_;
    auVar17._2_2_ = auVar10._0_2_;
    auVar16 = pmaddwd(auVar17,auVar2);
    auVar21._0_4_ = auVar16._0_4_ + auVar11._0_4_ + 0x100U >> 9;
    auVar21._4_4_ = auVar16._4_4_ + auVar11._4_4_ + 0x100U >> 9;
    auVar21._8_4_ = auVar16._8_4_ + auVar11._8_4_ + 0x100U >> 9;
    auVar21._12_4_ = auVar16._12_4_ + auVar11._12_4_ + 0x100U >> 9;
    auVar11 = pshufb(auVar21,ZEXT416(0xc080400));
    *(int *)dst = auVar11._0_4_;
    dst = dst + stride;
    auVar16._0_2_ = auVar9._0_2_ + 1;
    auVar16._2_2_ = auVar9._2_2_ + 1;
    auVar16._4_2_ = auVar9._4_2_ + 1;
    auVar16._6_2_ = auVar9._6_2_ + 1;
    auVar16._8_2_ = auVar9._8_2_ + 1;
    auVar16._10_2_ = auVar9._10_2_ + 1;
    auVar16._12_2_ = auVar9._12_2_ + 1;
    auVar16._14_2_ = auVar9._14_2_ + 1;
    auVar11._0_2_ = auVar8._0_2_ + 0x202;
    auVar11._2_2_ = auVar8._2_2_ + 0x202;
    auVar11._4_2_ = auVar8._4_2_ + 0x202;
    auVar11._6_2_ = auVar8._6_2_ + 0x202;
    auVar11._8_2_ = auVar8._8_2_ + 0x202;
    auVar11._10_2_ = auVar8._10_2_ + 0x202;
    auVar11._12_2_ = auVar8._12_2_ + 0x202;
    auVar11._14_2_ = auVar8._14_2_ + 0x202;
    iVar5 = iVar5 + -1;
    auVar8 = auVar11;
    auVar9 = auVar16;
  } while (iVar5 != 0);
  return;
}

Assistant:

static inline void load_pixel_w4(const uint8_t *above, const uint8_t *left,
                                 int height, __m128i *pixels) {
  __m128i d = _mm_cvtsi32_si128(((const int *)above)[0]);
  if (height == 4)
    pixels[1] = _mm_cvtsi32_si128(((const int *)left)[0]);
  else if (height == 8)
    pixels[1] = _mm_loadl_epi64(((const __m128i *)left));
  else
    pixels[1] = _mm_loadu_si128(((const __m128i *)left));

  pixels[2] = _mm_set1_epi16((int16_t)above[3]);

  const __m128i bp = _mm_set1_epi16((int16_t)left[height - 1]);
  const __m128i zero = _mm_setzero_si128();
  d = _mm_unpacklo_epi8(d, zero);
  pixels[0] = _mm_unpacklo_epi16(d, bp);
}